

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O3

void __thiscall warning_suppressor::restore(warning_suppressor *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->streambuf != (streambuf *)0x0) {
    set_streambuf(this->streambuf);
    this->streambuf = (streambuf *)0x0;
    sVar1 = logger::total_warnings - this->warnings;
    sVar2 = logger::total_errors - this->errors;
    logger::total_errors = this->errors;
    logger::total_warnings = this->warnings;
    this->warnings = sVar1;
    this->errors = sVar2;
  }
  return;
}

Assistant:

void restore() {
		
		if(!streambuf) {
			return;
		}
		
		set_streambuf(streambuf);
		streambuf = NULL;
		
		size_t new_warnings = logger::total_warnings - warnings;
		size_t new_errors = logger::total_errors - errors;
		logger::total_warnings = warnings;
		logger::total_errors = errors;
		warnings = new_warnings;
		errors = new_errors;
		
	}